

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<false,true,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalSet(wasm::LocalSet__(void *this,LocalSet *curr)

{
  EquivalentSets *this_00;
  Module *module;
  bool bVar1;
  Module *in_RAX;
  Expression *pEVar2;
  Drop *expression;
  Builder local_38;
  
  module = *(Module **)((long)this + 0xd0);
  local_38.wasm = in_RAX;
  pEVar2 = Properties::getFallthrough
                     (curr->value,(PassOptions *)((long)this + 0xf0),module,AllowTeeBrIf);
  this_00 = (EquivalentSets *)((long)this + 0x1b0);
  if (pEVar2->_id != LocalGetId) {
    EquivalentSets::reset(this_00,curr->index);
    return;
  }
  bVar1 = EquivalentSets::check(this_00,curr->index,*(Index *)(pEVar2 + 1));
  if (!bVar1) {
    EquivalentSets::reset(this_00,curr->index);
    EquivalentSets::add(this_00,curr->index,*(Index *)(pEVar2 + 1));
    return;
  }
  if (*(char *)((long)this + 0xe8) == '\x01') {
    bVar1 = LocalSet::isTee(curr);
    if (bVar1) {
      expression = (Drop *)curr->value;
      if ((expression->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id
          != (curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id) {
        *(undefined1 *)((long)this + 0x1a9) = 1;
      }
    }
    else {
      local_38.wasm = module;
      expression = Builder::makeDrop(&local_38,curr->value);
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::replaceCurrent
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this,
               (Expression *)expression);
    *(undefined1 *)((long)this + 0x1a8) = 1;
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }